

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O3

void __thiscall
QGraphicsItemAnimation::setTimeLine(QGraphicsItemAnimation *this,QTimeLine *timeLine)

{
  long lVar1;
  int *piVar2;
  undefined8 uVar3;
  QTimeLine *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)(this + 0x10);
  lVar1 = *(long *)(lVar5 + 8);
  if (lVar1 == 0) {
    if (timeLine == (QTimeLine *)0x0) goto LAB_00644fe8;
  }
  else {
    if (*(int *)(lVar1 + 4) == 0) {
      pQVar4 = (QTimeLine *)0x0;
    }
    else {
      pQVar4 = *(QTimeLine **)(lVar5 + 0x10);
    }
    if (pQVar4 == timeLine) goto LAB_00644fe8;
    if (((*(int *)(lVar1 + 4) != 0) && (*(long **)(lVar5 + 0x10) != (long *)0x0)) &&
       (*(int *)(lVar1 + 4) != 0)) {
      (**(code **)(**(long **)(lVar5 + 0x10) + 0x20))();
    }
    if (timeLine == (QTimeLine *)0x0) goto LAB_00644fe8;
    lVar5 = *(long *)(this + 0x10);
  }
  uVar3 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)timeLine);
  piVar2 = *(int **)(lVar5 + 8);
  *(undefined8 *)(lVar5 + 8) = uVar3;
  *(QTimeLine **)(lVar5 + 0x10) = timeLine;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  QObject::connect((QObject *)&CStack_28,(char *)timeLine,(QObject *)"2valueChanged(qreal)",
                   (char *)this,0x6f679e);
  QMetaObject::Connection::~Connection(&CStack_28);
LAB_00644fe8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemAnimation::setTimeLine(QTimeLine *timeLine)
{
    if (d->timeLine == timeLine)
        return;
    if (d->timeLine)
        delete d->timeLine;
    if (!timeLine)
        return;
    d->timeLine = timeLine;
    connect(timeLine, SIGNAL(valueChanged(qreal)), this, SLOT(setStep(qreal)));
}